

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::CwiseMultiply::forward_impl
          (CwiseMultiply *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs
          ,Tensor *fx)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  pointer ppTVar4;
  Tensor *pTVar5;
  Tensor *pTVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  int iVar16;
  uint uVar17;
  int iVar19;
  uint uVar20;
  Index index_1;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar18;
  
  ppTVar4 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4 != 0x10) {
    __assert_fail("xs.size() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/nodes.cc"
                  ,0x6d6,
                  "virtual void cnn::CwiseMultiply::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                 );
  }
  pTVar5 = *ppTVar4;
  uVar18 = (ulong)(pTVar5->d).nd;
  iVar16 = 1;
  iVar19 = 1;
  if (uVar18 != 0) {
    uVar21 = 0;
    do {
      iVar19 = iVar19 * (pTVar5->d).d[uVar21];
      uVar21 = uVar21 + 1;
    } while (uVar18 != uVar21);
  }
  uVar20 = iVar19 * (pTVar5->d).bd;
  pTVar6 = ppTVar4[1];
  uVar18 = (ulong)(pTVar6->d).nd;
  if (uVar18 != 0) {
    iVar16 = 1;
    uVar21 = 0;
    do {
      iVar16 = iVar16 * (pTVar6->d).d[uVar21];
      uVar21 = uVar21 + 1;
    } while (uVar18 != uVar21);
  }
  uVar17 = iVar16 * (pTVar6->d).bd;
  uVar18 = (ulong)uVar17;
  if (uVar20 == uVar17) {
    uVar21 = (ulong)(fx->d).nd;
    iVar16 = 1;
    if (uVar21 != 0) {
      uVar23 = 0;
      do {
        iVar16 = iVar16 * (fx->d).d[uVar23];
        uVar23 = uVar23 + 1;
      } while (uVar21 != uVar23);
    }
    if (iVar16 * (fx->d).bd == uVar20) {
      pfVar7 = fx->v;
      uVar21 = uVar18;
      if ((((ulong)pfVar7 & 3) == 0) &&
         (uVar21 = (ulong)(-((uint)((ulong)pfVar7 >> 2) & 0x3fffffff) & 3), uVar18 <= uVar21)) {
        uVar21 = uVar18;
      }
      pfVar8 = pTVar5->v;
      pfVar9 = pTVar6->v;
      uVar22 = uVar18 - uVar21;
      uVar23 = uVar22 + 3;
      if (-1 < (long)uVar22) {
        uVar23 = uVar22;
      }
      if (uVar21 != 0) {
        uVar24 = 0;
        do {
          pfVar7[uVar24] = pfVar8[uVar24] * pfVar9[uVar24];
          uVar24 = uVar24 + 1;
        } while (uVar21 != uVar24);
      }
      uVar23 = (uVar23 & 0xfffffffffffffffc) + uVar21;
      if (3 < (long)uVar22) {
        do {
          pfVar1 = pfVar8 + uVar21;
          fVar10 = pfVar1[1];
          fVar11 = pfVar1[2];
          fVar12 = pfVar1[3];
          pfVar2 = pfVar9 + uVar21;
          fVar13 = pfVar2[1];
          fVar14 = pfVar2[2];
          fVar15 = pfVar2[3];
          pfVar3 = pfVar7 + uVar21;
          *pfVar3 = *pfVar2 * *pfVar1;
          pfVar3[1] = fVar13 * fVar10;
          pfVar3[2] = fVar14 * fVar11;
          pfVar3[3] = fVar15 * fVar12;
          uVar21 = uVar21 + 4;
        } while ((long)uVar21 < (long)uVar23);
      }
      if ((long)uVar23 < (long)uVar18) {
        do {
          pfVar7[uVar23] = pfVar8[uVar23] * pfVar9[uVar23];
          uVar23 = uVar23 + 1;
        } while (uVar18 != uVar23);
      }
      return;
    }
    __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                  "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
                 );
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<float>, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
               );
}

Assistant:

void CwiseMultiply::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  assert(xs.size() == 2);
#if HAVE_CUDA
  gpu::vcwise_product(fx.d.size(), xs[0]->v, xs[1]->v, fx.v);
#else
  auto x1 = xs[0]->vec();
  auto x2 = xs[1]->vec();
  fx.vec() = x1.cwiseProduct(x2);
#endif
}